

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket_linux.cpp
# Opt level: O2

int sk_server_start_loop(int port,void *userdata)

{
  int iVar1;
  string local_30;
  
  std::__cxx11::to_string(&local_30,port);
  iVar1 = ep_server_start_loop(local_30._M_dataplus._M_p,userdata);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int sk_server_start_loop(int port, void* userdata) {
    return ep_server_start_loop(std::to_string(port).c_str(), userdata);
}